

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.cpp
# Opt level: O2

ServerPtr __thiscall Scs::CreateServer(Scs *this,ServerParams *params)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ServerPtr SVar2;
  undefined1 local_19;
  undefined8 local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::__shared_ptr<Scs::Server,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Scs::Allocator<Scs::Server>,Scs::ServerParams_const&>
            ((__shared_ptr<Scs::Server,(__gnu_cxx::_Lock_policy)2> *)&local_18,
             (Allocator<Scs::Server> *)&local_19,params);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)this = local_18;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var1._M_pi;
  local_18 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  SVar2.super___shared_ptr<Scs::IServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar2.super___shared_ptr<Scs::IServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ServerPtr)SVar2.super___shared_ptr<Scs::IServer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ServerPtr Scs::CreateServer(const ServerParams & params)
{
	return std::allocate_shared<Server>(Allocator<Server>(), params);
}